

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

void __thiscall
llvm::Expected<llvm::DWARFDebugNames::Abbrev>::~Expected
          (Expected<llvm::DWARFDebugNames::Abbrev> *this)

{
  storage_type *this_00;
  error_type *this_01;
  Expected<llvm::DWARFDebugNames::Abbrev> *this_local;
  
  assertIsChecked(this);
  if ((this->field_0x20 & 1) == 0) {
    this_00 = getStorage(this);
    DWARFDebugNames::Abbrev::~Abbrev(this_00);
  }
  else {
    this_01 = getErrorStorage(this);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (this_01);
  }
  return;
}

Assistant:

~Expected() {
    assertIsChecked();
    if (!HasError)
      getStorage()->~storage_type();
    else
      getErrorStorage()->~error_type();
  }